

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.c
# Opt level: O0

char * env_get(char *s)

{
  uint uVar1;
  int iVar2;
  int local_1c;
  uint len;
  int i;
  char *s_local;
  
  if (s != (char *)0x0) {
    uVar1 = str_len(s);
    local_1c = 0;
    while (*(long *)(_environ + (long)local_1c * 8) != 0) {
      iVar2 = str_start(*(char **)(_environ + (long)local_1c * 8),s);
      if ((iVar2 != 0) &&
         (*(char *)(*(long *)(_environ + (long)local_1c * 8) + (ulong)uVar1) == '=')) {
        return (char *)(*(long *)(_environ + (long)local_1c * 8) + (ulong)uVar1 + 1);
      }
      local_1c = local_1c + 1;
    }
  }
  return (char *)0x0;
}

Assistant:

extern /*@null@*/char *env_get(const char *s)
{
  int i;
  unsigned int len;

  if (!s) return 0;
  len = str_len(s);
  for (i = 0;environ[i];++i)
    if (str_start(environ[i],s) && (environ[i][len] == '='))
      return environ[i] + len + 1;
  return 0;
}